

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSearch.h
# Opt level: O3

string * __thiscall
HeaderSearch::operator()[abi_cxx11_(string *__return_storage_ptr__,HeaderSearch *this,Token *token)

{
  pointer pcVar1;
  size_type sVar2;
  Page *pPVar3;
  string_view subtoken;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  string transformedHtmlPage;
  string local_e8;
  string local_c8;
  string local_a8;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_88;
  char local_78;
  string local_70;
  string local_50;
  
  if (token->type == header) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/w/cpp/header","");
    pPVar3 = SearchBase::getPage(&this->super_SearchBase,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (pPVar3->content)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (pPVar3->content)._M_string_length);
    replaceHtmlSymbols(&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (token->content)._M_dataplus._M_p;
    sVar2 = (token->content)._M_string_length;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"<tt>","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"</tt>","");
    subtoken._M_str = pcVar1;
    subtoken._M_len = sVar2;
    SearchBase::findLinkToSubtoken
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               &local_88._M_value,&this->super_SearchBase,&local_50,subtoken,&local_e8,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_78 == '\0') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_88._M_value._M_str,
                 local_88._M_value._M_str + local_88._M_value._M_len);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::header) {
				return "";
			}


			Page* page = getPage("/w/cpp/header");
			const std::string transformedHtmlPage = replaceHtmlSymbols(page->content);
			const std::optional<std::string_view> link = findLinkToSubtoken(transformedHtmlPage, token.content, "<tt>", "</tt>");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}